

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool checkInterfacePropertyCompatibility<bool>
               (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
               bool *param_6)

{
  cmLocalGenerator *localGenerator;
  pointer ppcVar1;
  cmGeneratorTarget *this;
  pointer pbVar2;
  bool value;
  bool bVar3;
  bool bVar4;
  bool value_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar6;
  __uniq_ptr_data<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>,_true,_true>
  this_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  ostream *poVar8;
  string *psVar9;
  pointer ppcVar10;
  bool bVar11;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  genexInterpreter;
  string report;
  string local_290;
  string reportEntry;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  string local_208;
  string local_1e8;
  string interfaceProperty;
  ostringstream e;
  
  value = cmGeneratorTarget::GetPropertyAsBool(tgt,p);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&headPropKeys,tgt);
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (headPropKeys.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     headPropKeys.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar11 = _Var5._M_current !=
           headPropKeys.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = cmGeneratorTarget::IsNullImpliedByLinkLibraries(tgt,p);
  if (bVar3 && _Var5._M_current !=
               headPropKeys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorTarget.cxx"
                  ,0x1276,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = bool]"
                 );
  }
  pvVar6 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar6->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar6->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&report," * Target \"",(allocator<char> *)&e);
    cmGeneratorTarget::GetName_abi_cxx11_(tgt);
    std::__cxx11::string::append((string *)&report);
    if (_Var5._M_current !=
        headPropKeys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)&report);
      valueAsString<bool>((string *)&e,value);
      std::__cxx11::string::append((string *)&report);
      std::__cxx11::string::~string((string *)&e);
    }
    std::__cxx11::string::append((char *)&report);
    std::operator+(&interfaceProperty,"INTERFACE_",p);
    bVar4 = std::operator==(p,"POSITION_INDEPENDENT_CODE");
    if (bVar4) {
      this_00.
      super___uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmGeneratorExpressionInterpreter_*,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      .super__Head_base<0UL,_cmGeneratorExpressionInterpreter_*,_false>._M_head_impl =
           (__uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
            )operator_new(0x68);
      localGenerator = tgt->LocalGenerator;
      std::__cxx11::string::string((string *)&local_1e8,(string *)config);
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      local_208._M_string_length = 0;
      local_208.field_2._M_local_buf[0] = '\0';
      cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                ((cmGeneratorExpressionInterpreter *)
                 this_00.
                 super___uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmGeneratorExpressionInterpreter_*,_std::default_delete<cmGeneratorExpressionInterpreter>_>
                 .super__Head_base<0UL,_cmGeneratorExpressionInterpreter_*,_false>._M_head_impl,
                 localGenerator,&local_1e8,tgt,&local_208);
      genexInterpreter._M_t.
      super___uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmGeneratorExpressionInterpreter_*,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      .super__Head_base<0UL,_cmGeneratorExpressionInterpreter_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>,_true,_true>
            )(__uniq_ptr_data<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>,_true,_true>
              )this_00.
               super___uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratorExpressionInterpreter_*,_std::default_delete<cmGeneratorExpressionInterpreter>_>
               .super__Head_base<0UL,_cmGeneratorExpressionInterpreter_*,_false>._M_head_impl;
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    else {
      genexInterpreter._M_t.
      super___uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmGeneratorExpressionInterpreter_*,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      .super__Head_base<0UL,_cmGeneratorExpressionInterpreter_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>,_true,_true>
            )(__uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
              )0x0;
    }
    ppcVar1 = (pvVar6->
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar10 = (pvVar6->
                    super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                    )._M_impl.super__Vector_impl_data._M_start; ppcVar10 != ppcVar1;
        ppcVar10 = ppcVar10 + 1) {
      this = *ppcVar10;
      cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&propKeys,this);
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (propKeys.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         propKeys.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&interfaceProperty);
      pbVar2 = propKeys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      value_00 = getTypedProperty<bool>
                           (this,&interfaceProperty,
                            (cmGeneratorExpressionInterpreter *)
                            genexInterpreter._M_t.
                            super___uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmGeneratorExpressionInterpreter_*,_std::default_delete<cmGeneratorExpressionInterpreter>_>
                            .super__Head_base<0UL,_cmGeneratorExpressionInterpreter_*,_false>.
                            _M_head_impl);
      reportEntry._M_string_length = 0;
      reportEntry._M_dataplus._M_p = (pointer)&reportEntry.field_2;
      reportEntry.field_2._M_local_buf[0] = '\0';
      bVar4 = value;
      if (_Var7._M_current == pbVar2) {
        if (bVar3) {
          bVar4 = false;
        }
        if (_Var5._M_current !=
            headPropKeys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar4 = value;
        }
      }
      else {
        std::__cxx11::string::append((char *)&reportEntry);
        cmGeneratorTarget::GetName_abi_cxx11_(this);
        std::__cxx11::string::append((string *)&reportEntry);
        std::__cxx11::string::append((char *)&reportEntry);
        valueAsString<bool>((string *)&e,value_00);
        std::__cxx11::string::append((string *)&reportEntry);
        std::__cxx11::string::~string((string *)&e);
        std::__cxx11::string::append((char *)&reportEntry);
        if (_Var5._M_current ==
            headPropKeys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (bVar3) {
            std::__cxx11::string::append((string *)&report);
            compatibilityAgree_abi_cxx11_((string *)&e,t,false);
            std::__cxx11::string::append((string *)&report);
            std::__cxx11::string::~string((string *)&e);
            if (value_00) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              poVar8 = std::operator<<((ostream *)&e,"Property ");
              poVar8 = std::operator<<(poVar8,(string *)p);
              poVar8 = std::operator<<(poVar8," on target \"");
              psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
              poVar8 = std::operator<<(poVar8,(string *)psVar9);
              poVar8 = std::operator<<(poVar8,"\" is\nimplied to be ");
              poVar8 = std::operator<<(poVar8,defaultValue);
              poVar8 = std::operator<<(poVar8,
                                       " because it was used to determine the link libraries\nalready. The INTERFACE_"
                                      );
              poVar8 = std::operator<<(poVar8,(string *)p);
              poVar8 = std::operator<<(poVar8," property on\ndependency \"");
              psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this);
              poVar8 = std::operator<<(poVar8,(string *)psVar9);
              std::operator<<(poVar8,"\" is in conflict.\n");
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(&local_290);
              std::__cxx11::string::~string((string *)&local_290);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
              value = false;
              goto LAB_002c158d;
            }
            bVar4 = false;
          }
          else if (bVar11) {
            std::__cxx11::string::append((string *)&report);
            compatibilityAgree_abi_cxx11_((string *)&e,t,false);
            std::__cxx11::string::append((string *)&report);
            std::__cxx11::string::~string((string *)&e);
            bVar11 = true;
            if (value_00 != value) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              poVar8 = std::operator<<((ostream *)&e,"The INTERFACE_");
              poVar8 = std::operator<<(poVar8,(string *)p);
              poVar8 = std::operator<<(poVar8," property of \"");
              psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this);
              poVar8 = std::operator<<(poVar8,(string *)psVar9);
              poVar8 = std::operator<<(poVar8,"\" does\nnot agree with the value of ");
              poVar8 = std::operator<<(poVar8,(string *)p);
              poVar8 = std::operator<<(poVar8," already determined\nfor \"");
              psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
              poVar8 = std::operator<<(poVar8,(string *)psVar9);
              std::operator<<(poVar8,"\".\n");
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(&local_290);
              goto LAB_002c146c;
            }
          }
          else {
            std::operator+((string *)&e,&reportEntry,"(Interface set)\n");
            std::__cxx11::string::append((string *)&report);
            std::__cxx11::string::~string((string *)&e);
            bVar11 = true;
            bVar4 = value_00;
          }
        }
        else {
          std::__cxx11::string::append((string *)&report);
          compatibilityAgree_abi_cxx11_((string *)&e,t,false);
          std::__cxx11::string::append((string *)&report);
          std::__cxx11::string::~string((string *)&e);
          if (value_00 != value) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            poVar8 = std::operator<<((ostream *)&e,"Property ");
            poVar8 = std::operator<<(poVar8,(string *)p);
            poVar8 = std::operator<<(poVar8," on target \"");
            psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar8 = std::operator<<(poVar8,(string *)psVar9);
            poVar8 = std::operator<<(poVar8,"\" does\nnot match the INTERFACE_");
            poVar8 = std::operator<<(poVar8,(string *)p);
            poVar8 = std::operator<<(poVar8," property requirement\nof dependency \"");
            psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this);
            poVar8 = std::operator<<(poVar8,(string *)psVar9);
            std::operator<<(poVar8,"\".\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(&local_290);
LAB_002c146c:
            std::__cxx11::string::~string((string *)&local_290);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
LAB_002c158d:
            std::__cxx11::string::~string((string *)&reportEntry);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&propKeys);
            break;
          }
        }
      }
      value = bVar4;
      std::__cxx11::string::~string((string *)&reportEntry);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&propKeys);
    }
    valueAsString<bool>((string *)&e,value);
    compatibilityType_abi_cxx11_(&reportEntry,t);
    cmGeneratorTarget::ReportPropertyOrigin(tgt,p,(string *)&e,&report,&reportEntry);
    std::__cxx11::string::~string((string *)&reportEntry);
    std::__cxx11::string::~string((string *)&e);
    std::
    unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
    ::~unique_ptr(&genexInterpreter);
    std::__cxx11::string::~string((string *)&interfaceProperty);
    std::__cxx11::string::~string((string *)&report);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&headPropKeys);
  return value;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
    std::find(headPropKeys.begin(), headPropKeys.end(), p) !=
    headPropKeys.end();

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter(
    p == "POSITION_INDEPENDENT_CODE" ? new cmGeneratorExpressionInterpreter(
                                         tgt->GetLocalGenerator(), config, tgt)
                                     : nullptr);

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = std::find(propKeys.begin(), propKeys.end(),
                                      interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}